

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O0

Own<kj::File> kj::anon_unknown_0::newTempFile(void)

{
  int osErrorNumber;
  void *pvVar1;
  File *extraout_RDX;
  kj *in_RDI;
  Own<kj::File> OVar2;
  AutoCloseFd local_88;
  Type local_80;
  undefined1 local_78 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
  _kjDefer213;
  Fault local_58;
  Fault f;
  SyscallResult local_40;
  undefined1 local_3c [4];
  SyscallResult _kjSyscallResult;
  int fd;
  char filename [35];
  
  memcpy(&_kjSyscallResult,"/var/tmp/kj-filesystem-test.XXXXXX",0x23);
  f.exception = (Exception *)local_3c;
  local_40 = _::Debug::syscall<kj::(anonymous_namespace)::newTempFile()::__0>
                       ((anon_class_16_2_18894a62 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_40);
  if (pvVar1 != (void *)0x0) {
    local_80.filename = (char (*) [35])&_kjSyscallResult;
    defer<kj::(anonymous_namespace)::newTempFile()::__1>((kj *)local_78,&local_80);
    AutoCloseFd::AutoCloseFd(&local_88,(int)local_3c);
    newDiskFile(in_RDI,&local_88);
    AutoCloseFd::~AutoCloseFd(&local_88);
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++:213:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
                 *)local_78);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)in_RDI;
    return OVar2;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_40);
  _::Debug::Fault::Fault
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
             ,0xd4,osErrorNumber,"fd = mkstemp(filename)","");
  _::Debug::Fault::fatal(&local_58);
}

Assistant:

static Own<File> newTempFile() {
  char filename[] = VAR_TMP "/kj-filesystem-test.XXXXXX";
  int fd;
  KJ_SYSCALL(fd = mkstemp(filename));
  KJ_DEFER(KJ_SYSCALL(unlink(filename)));
  return newDiskFile(AutoCloseFd(fd));
}